

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int patchtestreg(FuncState *fs,int node,int reg)

{
  Instruction *pIVar1;
  uint in_EDX;
  int in_ESI;
  FuncState *in_RDI;
  Instruction *i;
  undefined4 local_4;
  
  pIVar1 = getjumpcontrol(in_RDI,in_ESI);
  if ((*pIVar1 & 0x3f) == 0x1b) {
    if ((in_EDX == 0xff) || (in_EDX == *pIVar1 >> 0x17)) {
      *pIVar1 = (*pIVar1 >> 0x17) << 6 | 0x1a | (*pIVar1 >> 0xe & 0x1ff) << 0xe;
    }
    else {
      *pIVar1 = *pIVar1 & 0xffffc03f | (in_EDX & 0xff) << 6;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int patchtestreg(FuncState*fs,int node,int reg){
Instruction*i=getjumpcontrol(fs,node);
if(GET_OPCODE(*i)!=OP_TESTSET)
return 0;
if(reg!=((1<<8)-1)&&reg!=GETARG_B(*i))
SETARG_A(*i,reg);
else
*i=CREATE_ABC(OP_TEST,GETARG_B(*i),0,GETARG_C(*i));
return 1;
}